

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::format_system_error(buffer *out,int error_code,string_view message)

{
  int iVar1;
  void *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  writer w;
  int result;
  char *system_message;
  memory_buffer buf;
  basic_buffer<char> *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 uVar2;
  locale_ref loc;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_fffffffffffffd30;
  char **in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd44;
  int local_2b8;
  void *local_2b0;
  int local_2a8;
  void *local_2a0;
  int in_stack_fffffffffffffd7c;
  locale_ref in_stack_fffffffffffffd80;
  string_view in_stack_fffffffffffffd88;
  undefined1 local_239 [541];
  undefined4 local_1c;
  undefined8 local_10;
  void *pvStack_8;
  
  loc.locale_ = local_239;
  local_1c = in_ESI;
  local_10 = in_RDX;
  pvStack_8 = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (allocator<char> *)in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)local_239);
  internal::basic_buffer<char>::resize
            ((basic_buffer<char> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_t)in_stack_fffffffffffffd18);
  do {
    internal::basic_buffer<char>::operator[]((basic_buffer<char> *)(local_239 + 1),0);
    uVar2 = local_1c;
    internal::basic_buffer<char>::size((basic_buffer<char> *)(local_239 + 1));
    iVar1 = anon_unknown_5::safe_strerror
                      (in_stack_fffffffffffffd44,in_stack_fffffffffffffd38,
                       (size_t)in_stack_fffffffffffffd30.container);
    if (iVar1 == 0) {
      back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
                ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)
                 in_stack_fffffffffffffd30.container,(basic_buffer<char> *)loc.locale_);
      internal::locale_ref::locale_ref((locale_ref *)&stack0xfffffffffffffd80);
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
      basic_writer((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                    *)CONCAT44(uVar2,in_stack_fffffffffffffd20),
                   (back_insert_range<fmt::v5::internal::basic_buffer<char>_>)
                   in_stack_fffffffffffffd30.container,loc);
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                  *)&stack0xfffffffffffffd90,(int)local_10,pvStack_8,(size_t)in_RCX);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)CONCAT44(uVar2,in_stack_fffffffffffffd20),
                 (char *)in_stack_fffffffffffffd18);
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                  *)&stack0xfffffffffffffd90,local_2a8,local_2a0,(size_t)in_RCX);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)CONCAT44(uVar2,in_stack_fffffffffffffd20),
                 (char *)in_stack_fffffffffffffd18);
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                  *)&stack0xfffffffffffffd90,local_2b8,local_2b0,(size_t)in_RCX);
      iVar1 = 1;
LAB_00140267:
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT44(uVar2,in_stack_fffffffffffffd20));
      if (iVar1 == 0) {
        anon_unknown_5::format_error_code
                  ((buffer *)in_stack_fffffffffffffd80.locale_,in_stack_fffffffffffffd7c,
                   in_stack_fffffffffffffd88);
      }
      return;
    }
    if (iVar1 != 0x22) {
      iVar1 = 0;
      goto LAB_00140267;
    }
    in_stack_fffffffffffffd18 = (basic_buffer<char> *)(local_239 + 1);
    internal::basic_buffer<char>::size(in_stack_fffffffffffffd18);
    internal::basic_buffer<char>::resize
              ((basic_buffer<char> *)CONCAT44(uVar2,in_stack_fffffffffffffd20),
               (size_t)in_stack_fffffffffffffd18);
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(
    internal::buffer &out, int error_code, string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char *system_message = &buf[0];
      int result = safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }